

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtobj.cpp
# Opt level: O1

vm_tadsobj_prop * __thiscall vm_tadsobj_hdr::find_prop_entry(vm_tadsobj_hdr *this,uint prop)

{
  vm_tadsobj_prop *pvVar1;
  
  for (pvVar1 = this->hash_arr[this->hash_siz - 1 & prop];
      (pvVar1 != (vm_tadsobj_prop *)0x0 && (pvVar1->prop != prop)); pvVar1 = pvVar1->nxt) {
  }
  return pvVar1;
}

Assistant:

vm_tadsobj_prop *vm_tadsobj_hdr::find_prop_entry(uint prop)
{
    /* scan the list of entries in this bucket */
    for (vm_tadsobj_prop *entry = hash_arr[calc_hash(prop)] ;
         entry != 0 ; entry = entry->nxt)
    {
        /* if this entry matches, return it */
        if (entry->prop == prop)
            return entry;
    }

    /* didn't find it */
    return 0;
}